

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCP_USB.cpp
# Opt level: O0

unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> SuperCardProUSB::Open(void)

{
  int fd_00;
  ulong uVar1;
  char *__file;
  SuperCardProUSB *this;
  __uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true> in_RDI;
  int fd;
  string local_30 [8];
  string path;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator=(local_30,"/dev/ttyUSB0");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    fd_00 = open64(__file,2);
    if (0 < fd_00) {
      this = (SuperCardProUSB *)operator_new(0x18);
      SuperCardProUSB(this,fd_00);
      std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>::
      unique_ptr<std::default_delete<SuperCardPro>,void>
                ((unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>> *)
                 in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t
                 .super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
                 super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl,(pointer)this);
      goto LAB_0022bf80;
    }
  }
  std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>::
  unique_ptr<std::default_delete<SuperCardPro>,void>
            ((unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>> *)
             in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
             super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
             super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl);
LAB_0022bf80:
  std::__cxx11::string::~string(local_30);
  return (__uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true>)
         (tuple<SuperCardPro_*,_std::default_delete<SuperCardPro>_>)
         in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
         super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
         super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SuperCardPro> SuperCardProUSB::Open()
{
    std::string path;
#ifdef _WIN32
    path = SuperCardProWin32::GetDevicePath();
#elif defined(__linux__)
    path = "/dev/ttyUSB0";
#elif defined(__APPLE__)
    path = "/dev/cu.usbserial-SCP-JIM";
#endif

    if (!path.empty())
    {
        int fd = open(path.c_str(), O_RDWR | O_BINARY);
        if (fd > 0)
        {
#ifdef _WIN32
            DCB dcb = { sizeof(dcb) };
            if (BuildCommDCB("baud=9600 parity=N data=8 stop=1", &dcb))
            {
                HANDLE h = reinterpret_cast<HANDLE>(_get_osfhandle(fd));
                SetCommState(h, &dcb);
            }
#endif
            return std::unique_ptr<SuperCardPro>(new SuperCardProUSB(fd));
        }
    }
    return std::unique_ptr<SuperCardPro>();
}